

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType __thiscall ValueType::ToDefinitePrimitiveSubset(ValueType *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type TVar4;
  Bits BVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  TVar4 = Null|Undefined;
  if (((this->field_0).bits & Object) == 0) {
    TVar4 = Simd|PrimitiveOrObject|Symbol|String|Boolean|Number|Float|Int|Null|Undefined;
  }
  if ((TVar4 & (this->field_0).bits) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3dd,"(HasBeenPrimitive())","HasBeenPrimitive()");
    if (!bVar2) goto LAB_00b21e1f;
    *puVar3 = 0;
  }
  if (((this->field_0).bits & (PrimitiveOrObject|Object)) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3de,"(HasBeenObject())","HasBeenObject()");
    if (!bVar2) {
LAB_00b21e1f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BVar5 = CanBeTaggedValue|Null|Undefined;
  if (((this->field_0).bits & Object) == 0) {
    BVar5 = Simd|Symbol|String|Boolean|Number|Float|IntIsLikelyUntagged|IntCanBeUntagged|Int|
            CanBeTaggedValue|Null|Undefined;
  }
  ValueType((ValueType *)&local_1a.field_0,BVar5 & (this->field_0).bits);
  Verify((ValueType)local_1a.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)local_1a.field_0;
}

Assistant:

ValueType ValueType::ToDefinitePrimitiveSubset() const
{
    // This function does not do a safe conversion of an arbitrary type to a definitely-primitive type. It only obtains the
    // primitive subset of bits from the type.

    // When Undefined (or Null) merge with Object, the resulting value type is still likely Object (IsLikelyObject() returns
    // true). ToDefinite() on the merged type would return a type that is definitely Undefined or Object. Usually, that type is
    // not interesting and a test for one or more of the primitive types may have been done. ToDefinitePrimitive() removes the
    // object-specific bits.

    Assert(HasBeenPrimitive());
    Assert(HasBeenObject());

    // If we have an object format of a type (object bit = 1) that represents a primitive (e.g. SIMD128),
    // we want to keep the object bit and type along with other merged primitives (Undefined and/or Null).
    if (IsLikelyObject() && IsLikelyPrimitive())
        return Verify(bits & (Bits::Undefined | Bits::Null) | ToDefiniteObject().bits);

    return
        Verify(
        bits &
        (
            OneOn(Bits::Object)
                ?
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT) - (Bits::Likely | Bits::Object)
                    :
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT + VALUE_TYPE_NONOBJECT_BIT_COUNT) -
                        (Bits::Likely | Bits::Object | Bits::PrimitiveOrObject)
            ));
}